

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::Shell__GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,char *in,int flags)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  cmOutputConverter *pcVar6;
  char *pcVar7;
  char cVar8;
  uint flags_00;
  char *pcVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  ostringstream out;
  
  bVar2 = (byte)in;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  flags_00 = (uint)in;
  iVar4 = Shell__ArgumentNeedsQuotes((char *)this,flags_00);
  if (iVar4 != 0) {
    cVar8 = '\"';
    if (((char)bVar2 < '\0') && (cVar8 = '\'', (flags_00 >> 8 & 1) != 0)) {
      std::operator<<((ostream *)&out,'\"');
    }
    std::operator<<((ostream *)&out,cVar8);
  }
  pcVar7 = "$$";
  if (((ulong)in & 1) == 0) {
    pcVar7 = "\"$\"";
  }
  uVar12 = 0;
  for (; bVar10 = *(byte *)&(this->StateSnapshot).State, bVar10 != 0;
      this = (cmOutputConverter *)((long)&(this->StateSnapshot).State + 1)) {
    if ((((ulong)in & 0x40) != 0) &&
       (pcVar6 = (cmOutputConverter *)Shell__SkipMakeVariables((char *)this), pcVar6 != this)) {
      for (; this != pcVar6; this = (cmOutputConverter *)((long)&(this->StateSnapshot).State + 1)) {
        std::operator<<((ostream *)&out,*(char *)&(this->StateSnapshot).State);
      }
      bVar10 = *(byte *)&(this->StateSnapshot).State;
      uVar12 = 0;
      if (bVar10 == 0) break;
    }
    if ((flags_00 >> 8 & 1) == 0) {
      if (((ulong)in & 4) != 0) {
LAB_0031d162:
        bVar10 = *(byte *)&(this->StateSnapshot).State;
        uVar3 = uVar12;
        goto LAB_0031d168;
      }
      if (bVar10 != 0x5c) {
        uVar3 = 0;
        if (bVar10 != 0x22) goto LAB_0031d168;
        iVar11 = uVar12 + 1;
        while (iVar11 = iVar11 + -1, 0 < iVar11) {
          std::operator<<((ostream *)&out,'\\');
        }
        std::operator<<((ostream *)&out,'\\');
        uVar12 = (int)uVar12 >> 0x1f & uVar12;
        goto LAB_0031d162;
      }
      uVar12 = uVar12 + 1;
      bVar10 = 0x5c;
LAB_0031d1da:
      std::operator<<((ostream *)&out,bVar10);
    }
    else {
      uVar5 = bVar10 - 0x22;
      uVar3 = uVar12;
      if ((uVar5 < 0x3f) && ((0x4400000000000005U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
        std::operator<<((ostream *)&out,'\\');
        goto LAB_0031d162;
      }
LAB_0031d168:
      uVar12 = uVar3;
      if (bVar10 == 0x23) {
        pcVar9 = "$#";
        if ((flags_00 & 9) != 9) goto LAB_0031d1a3;
      }
      else {
        if (bVar10 == 0x3b) {
          uVar1 = (ulong)in & 2;
          pcVar9 = "\";\"";
        }
        else {
          if (bVar10 == 0x25) {
            pcVar9 = "%%";
            if ((((ulong)in & 0x30) != 0 & bVar2) == 0 && (char)((flags_00 & 2) >> 1) == '\0')
            goto LAB_0031d1a3;
            goto LAB_0031d18c;
          }
          if (bVar10 != 0x24) goto LAB_0031d1da;
          uVar1 = (ulong)in & 3;
          pcVar9 = pcVar7;
        }
        if (uVar1 == 0) {
LAB_0031d1a3:
          std::operator<<((ostream *)&out,bVar10);
          goto LAB_0031d1e6;
        }
      }
LAB_0031d18c:
      std::operator<<((ostream *)&out,pcVar9);
    }
LAB_0031d1e6:
  }
  if (iVar4 != 0) {
    iVar4 = uVar12 + 1;
    while (iVar4 = iVar4 + -1, 0 < iVar4) {
      std::operator<<((ostream *)&out,'\\');
    }
    if ((-1 < (char)bVar2) || (std::operator<<((ostream *)&out,'\''), (flags_00 >> 8 & 1) != 0)) {
      std::operator<<((ostream *)&out,'\"');
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Shell__GetArgument(const char* in, int flags)
{
  std::ostringstream out;

  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = Shell__ArgumentNeedsQuotes(in, flags);
  if (needQuotes) {
    /* Add the opening quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      if (flags & Shell_Flag_IsUnix) {
        out << '"';
      }
      out << '\'';
    } else {
      out << '"';
    }
  }

  /* Scan the string for characters that require escaping or quoting.  */
  for (c = in; *c; ++c) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
      const char* skip = Shell__SkipMakeVariables(c);
      if (skip != c) {
        /* Copy to the end of the make variable references.  */
        while (c != skip) {
          out << *c++;
        }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if (!*c) {
          break;
        }
      }
    }

    /* Check whether this character needs escaping for the shell.  */
    if (flags & Shell_Flag_IsUnix) {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if (*c == '\\' || *c == '"' || *c == '`' || *c == '$') {
        /* This character needs a backslash to escape it.  */
        out << '\\';
      }
    } else if (flags & Shell_Flag_EchoWindows) {
      /* On Windows the built-in command shell echo never needs escaping.  */
    } else {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if (*c == '\\') {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
      } else if (*c == '"') {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while (windows_backslashes > 0) {
          --windows_backslashes;
          out << '\\';
        }

        /* Add the backslash to escape the double-quote.  */
        out << '\\';
      } else {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
      }
    }

    /* Check whether this character needs escaping for a make tool.  */
    if (*c == '$') {
      if (flags & Shell_Flag_Make) {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        out << "$$";
      } else if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        out << "\"$\"";
      } else {
        /* Otherwise a dollar is written just $. */
        out << '$';
      }
    } else if (*c == '#') {
      if ((flags & Shell_Flag_Make) && (flags & Shell_Flag_WatcomWMake)) {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        out << "$#";
      } else {
        /* Otherwise a pound is written just #. */
        out << '#';
      }
    } else if (*c == '%') {
      if ((flags & Shell_Flag_VSIDE) ||
          ((flags & Shell_Flag_Make) &&
           ((flags & Shell_Flag_MinGWMake) || (flags & Shell_Flag_NMake)))) {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        out << "%%";
      } else {
        /* Otherwise a percent is written just %. */
        out << '%';
      }
    } else if (*c == ';') {
      if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        out << "\";\"";
      } else {
        /* Otherwise a semicolon is written just ;. */
        out << ';';
      }
    } else {
      /* Store this character.  */
      out << *c;
    }
  }

  if (needQuotes) {
    /* Add enough backslashes to escape any trailing ones.  */
    while (windows_backslashes > 0) {
      --windows_backslashes;
      out << '\\';
    }

    /* Add the closing quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      out << '\'';
      if (flags & Shell_Flag_IsUnix) {
        out << '"';
      }
    } else {
      out << '"';
    }
  }

  return out.str();
}